

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3EvalDlPhraseNext(Fts3Table *pTab,Fts3Doclist *pDL,u8 *pbEof)

{
  int iVar1;
  char *pBuf;
  char *pcVar2;
  sqlite3_int64 iDelta;
  long local_38;
  char *local_30;
  
  pcVar2 = pDL->aAll + pDL->nAll;
  pBuf = pDL->pNextDocid;
  if (pDL->pNextDocid == (char *)0x0) {
    pBuf = pDL->aAll;
  }
  if (pBuf < pcVar2) {
    iVar1 = sqlite3Fts3GetVarint(pBuf,&local_38);
    local_30 = pBuf + iVar1;
    if ((pTab->bDescIdx == '\0') || (pDL->pNextDocid == (char *)0x0)) {
      pDL->iDocid = pDL->iDocid + local_38;
    }
    else {
      pDL->iDocid = pDL->iDocid - local_38;
    }
    pDL->pList = local_30;
    fts3PoslistCopy((char **)0x0,&local_30);
    pDL->nList = (int)local_30 - *(int *)&pDL->pList;
    for (; (local_30 < pcVar2 && (*local_30 == '\0')); local_30 = local_30 + 1) {
    }
    pDL->pNextDocid = local_30;
    *pbEof = '\0';
  }
  else {
    *pbEof = '\x01';
  }
  return;
}

Assistant:

static void fts3EvalDlPhraseNext(
  Fts3Table *pTab,
  Fts3Doclist *pDL,
  u8 *pbEof
){
  char *pIter;                            /* Used to iterate through aAll */
  char *pEnd = &pDL->aAll[pDL->nAll];     /* 1 byte past end of aAll */
 
  if( pDL->pNextDocid ){
    pIter = pDL->pNextDocid;
  }else{
    pIter = pDL->aAll;
  }

  if( pIter>=pEnd ){
    /* We have already reached the end of this doclist. EOF. */
    *pbEof = 1;
  }else{
    sqlite3_int64 iDelta;
    pIter += sqlite3Fts3GetVarint(pIter, &iDelta);
    if( pTab->bDescIdx==0 || pDL->pNextDocid==0 ){
      pDL->iDocid += iDelta;
    }else{
      pDL->iDocid -= iDelta;
    }
    pDL->pList = pIter;
    fts3PoslistCopy(0, &pIter);
    pDL->nList = (int)(pIter - pDL->pList);

    /* pIter now points just past the 0x00 that terminates the position-
    ** list for document pDL->iDocid. However, if this position-list was
    ** edited in place by fts3EvalNearTrim(), then pIter may not actually
    ** point to the start of the next docid value. The following line deals
    ** with this case by advancing pIter past the zero-padding added by
    ** fts3EvalNearTrim().  */
    while( pIter<pEnd && *pIter==0 ) pIter++;

    pDL->pNextDocid = pIter;
    assert( pIter>=&pDL->aAll[pDL->nAll] || *pIter );
    *pbEof = 0;
  }
}